

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

void super_stats(int nsuper,int *xsup)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  int bucket [10];
  uint local_58 [12];
  
  if (nsuper < 0) {
    uVar8 = 0;
    uVar6 = 0;
  }
  else {
    uVar3 = 0;
    uVar6 = 0;
    uVar8 = 0;
    iVar5 = *xsup;
    do {
      lVar4 = uVar3 + 1;
      uVar3 = uVar3 + 1;
      uVar7 = xsup[lVar4] - iVar5;
      uVar8 = uVar8 + (uVar7 == 1);
      if ((int)uVar6 <= (int)uVar7) {
        uVar6 = uVar7;
      }
      iVar5 = xsup[lVar4];
    } while (nsuper + 1 != uVar3);
  }
  printf("    Supernode statistics:\n\tno of super = %d\n");
  printf("\tmax supernode size = %d\n",(ulong)uVar6);
  printf("\tno of size 1 supernodes = %d\n",(ulong)uVar8);
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  fVar9 = (float)(int)uVar6;
  if (-1 < nsuper) {
    uVar3 = 0;
    iVar5 = *xsup;
    do {
      iVar2 = xsup[uVar3 + 1];
      iVar5 = (int)(((float)(iVar2 - iVar5) / fVar9) * 10.0);
      if (8 < iVar5) {
        iVar5 = 9;
      }
      uVar3 = uVar3 + 1;
      local_58[iVar5] = local_58[iVar5] + 1;
      iVar5 = iVar2;
    } while (nsuper + 1 != uVar3);
  }
  puts("\tHistogram of supernode sizes:");
  lVar4 = 0;
  do {
    lVar1 = lVar4 + 1;
    printf("\tsnode: %d-%d\t\t%d\n",(ulong)((int)(((float)(int)lVar4 * fVar9) / 10.0) + 1),
           (ulong)(uint)(int)(((float)(int)lVar1 * fVar9) / 10.0),(ulong)local_58[lVar4]);
    lVar4 = lVar1;
  } while (lVar1 != 10);
  return;
}

Assistant:

void super_stats(int nsuper, const int *xsup)
{
    register int nsup1 = 0;
    int    i, isize, whichb, bl, bh;
    int    bucket[NBUCKS];
    int    max_sup_size = 0;

    for (i = 0; i <= nsuper; i++) {
	isize = xsup[i+1] - xsup[i];
	if ( isize == 1 ) nsup1++;
	if ( max_sup_size < isize ) max_sup_size = isize;	
    }

    printf("    Supernode statistics:\n\tno of super = %d\n", nsuper+1);
    printf("\tmax supernode size = %d\n", max_sup_size);
    printf("\tno of size 1 supernodes = %d\n", nsup1);

    /* Histogram of the supernode sizes */
    ifill (bucket, NBUCKS, 0);

    for (i = 0; i <= nsuper; i++) {
        isize = xsup[i+1] - xsup[i];
        whichb = (float) isize / max_sup_size * NBUCKS;
        if (whichb >= NBUCKS) whichb = NBUCKS - 1;
        bucket[whichb]++;
    }
    
    printf("\tHistogram of supernode sizes:\n");
    for (i = 0; i < NBUCKS; i++) {
        bl = (float) i * max_sup_size / NBUCKS;
        bh = (float) (i+1) * max_sup_size / NBUCKS;
        printf("\tsnode: %d-%d\t\t%d\n", bl+1, bh, bucket[i]);
    }

}